

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vktPipelineRenderToImageTests.cpp
# Opt level: O0

void vkt::pipeline::anon_unknown_0::drawToMipLevel
               (Context *context,CaseDef_conflict *caseDef,int mipLevel,IVec4 *mipSize,int numSlices
               ,VkImage colorImage,VkImage depthStencilImage,VkBuffer vertexBuffer,
               VkPipelineLayout pipelineLayout,VkShaderModule vertexModule,
               VkShaderModule fragmentModule)

{
  VkFormat VVar1;
  VkCommandBuffer_s *pVVar2;
  VkImageSubresourceRange subresourceRange;
  VkImageSubresourceRange subresourceRange_00;
  RefData<vk::Handle<(vk::HandleType)17>_> data;
  RefData<vk::Handle<(vk::HandleType)23>_> data_00;
  RefData<vk::Handle<(vk::HandleType)24>_> data_01;
  RefData<vk::VkCommandBuffer_s_*> data_02;
  deUint32 dVar3;
  VkImageAspectFlags aspectMask;
  VkImageViewType viewType;
  deUint32 dVar4;
  deUint32 height;
  VkResult result;
  DeviceInterface *vk_00;
  VkDevice device_00;
  VkQueue queue_00;
  reference pvVar5;
  RefBase<vk::Handle<(vk::HandleType)13>_> *pRVar6;
  Handle<(vk::HandleType)13> *pHVar7;
  Handle<(vk::HandleType)17> *pHVar8;
  reference pvVar9;
  RefBase<vk::Handle<(vk::HandleType)18>_> *pRVar10;
  Handle<(vk::HandleType)18> *pHVar11;
  size_type sVar12;
  reference pAttachments;
  Handle<(vk::HandleType)24> *pHVar13;
  VkCommandBuffer_s **ppVVar14;
  VkExtent2D VVar15;
  Handle<(vk::HandleType)23> *pHVar16;
  uint local_464;
  undefined8 uStack_460;
  deUint32 subpassNdx_2;
  VkDeviceSize vertexBufferOffset;
  VkRenderPassBeginInfo renderPassBeginInfo;
  VkRect2D renderArea;
  VkClearValue local_400;
  __normal_iterator<vk::VkClearValue_*,_std::vector<vk::VkClearValue,_std::allocator<vk::VkClearValue>_>_>
  local_3f0;
  const_iterator local_3e8;
  allocator<vk::VkClearValue> local_3d9;
  VkClearValue local_3d8;
  undefined1 local_3c8 [8];
  vector<vk::VkClearValue,_std::allocator<vk::VkClearValue>_> clearValues;
  Move<vk::VkCommandBuffer_s_*> local_3a8;
  RefData<vk::VkCommandBuffer_s_*> local_388;
  undefined1 local_368 [8];
  Unique<vk::VkCommandBuffer_s_*> cmdBuffer;
  RefData<vk::Handle<(vk::HandleType)24>_> local_328;
  undefined1 local_308 [8];
  Unique<vk::Handle<(vk::HandleType)24>_> cmdPool;
  Move<vk::Handle<(vk::HandleType)23>_> local_2e0;
  RefData<vk::Handle<(vk::HandleType)23>_> local_2c0;
  undefined1 local_2a0 [8];
  Unique<vk::Handle<(vk::HandleType)23>_> framebuffer;
  undefined8 uStack_278;
  deUint32 local_270;
  Move<vk::Handle<(vk::HandleType)13>_> local_260;
  value_type local_240;
  deUint32 local_22c;
  undefined1 local_228 [4];
  int subpassNdx_1;
  VkShaderModule local_220;
  VkShaderModule local_218;
  VkRenderPass local_210;
  VkPipelineLayout local_208;
  VkPipeline local_200;
  Move<vk::Handle<(vk::HandleType)18>_> local_1f8;
  value_type local_1d8;
  VkImageSubresourceRange local_1c8;
  VkImage local_1b0;
  Move<vk::Handle<(vk::HandleType)13>_> local_1a8;
  value_type local_188;
  deUint32 local_174;
  Handle<(vk::HandleType)18> HStack_170;
  int subpassNdx;
  VkPipeline basePipeline;
  vector<vk::Handle<(vk::HandleType)13>,_std::allocator<vk::Handle<(vk::HandleType)13>_>_>
  attachmentHandles;
  vector<de::SharedPtr<vk::refdetails::Unique<vk::Handle<(vk::HandleType)13>_>_>,_std::allocator<de::SharedPtr<vk::refdetails::Unique<vk::Handle<(vk::HandleType)13>_>_>_>_>
  depthStencilAttachments;
  vector<de::SharedPtr<vk::refdetails::Unique<vk::Handle<(vk::HandleType)13>_>_>,_std::allocator<de::SharedPtr<vk::refdetails::Unique<vk::Handle<(vk::HandleType)13>_>_>_>_>
  colorAttachments;
  vector<de::SharedPtr<vk::refdetails::Unique<vk::Handle<(vk::HandleType)18>_>_>,_std::allocator<de::SharedPtr<vk::refdetails::Unique<vk::Handle<(vk::HandleType)18>_>_>_>_>
  pipelines;
  Move<vk::Handle<(vk::HandleType)17>_> local_f8;
  RefData<vk::Handle<(vk::HandleType)17>_> local_d8;
  undefined1 local_b8 [8];
  Unique<vk::Handle<(vk::HandleType)17>_> renderPass;
  bool useStencil;
  bool useDepth;
  VkImageAspectFlags depthStencilAspect;
  deUint32 queueFamilyIndex;
  VkQueue queue;
  VkDevice device;
  DeviceInterface *vk;
  int numSlices_local;
  IVec4 *mipSize_local;
  int mipLevel_local;
  CaseDef_conflict *caseDef_local;
  Context *context_local;
  VkShaderModule fragmentModule_local;
  VkShaderModule vertexModule_local;
  VkPipelineLayout pipelineLayout_local;
  VkBuffer vertexBuffer_local;
  VkImage depthStencilImage_local;
  VkImage colorImage_local;
  
  pipelineLayout_local.m_internal = vertexBuffer.m_internal;
  vk_00 = Context::getDeviceInterface(context);
  device_00 = Context::getDevice(context);
  queue_00 = Context::getUniversalQueue(context);
  dVar3 = Context::getUniversalQueueFamilyIndex(context);
  aspectMask = getFormatAspectFlags(caseDef->depthStencilFormat);
  renderPass.super_RefBase<vk::Handle<(vk::HandleType)17>_>.m_data.deleter.m_allocator._7_1_ =
       (byte)((aspectMask & 2) >> 1);
  renderPass.super_RefBase<vk::Handle<(vk::HandleType)17>_>.m_data.deleter.m_allocator._6_1_ =
       (byte)((aspectMask & 4) >> 2);
  makeRenderPass(&local_f8,vk_00,device_00,caseDef->colorFormat,caseDef->depthStencilFormat,
                 numSlices,VK_IMAGE_LAYOUT_COLOR_ATTACHMENT_OPTIMAL,
                 VK_IMAGE_LAYOUT_DEPTH_STENCIL_ATTACHMENT_OPTIMAL);
  ::vk::refdetails::Move::operator_cast_to_RefData(&local_d8,(Move *)&local_f8);
  data.deleter.m_deviceIface._0_4_ = (int)local_d8.deleter.m_deviceIface;
  data.object.m_internal = local_d8.object.m_internal;
  data.deleter.m_deviceIface._4_4_ = (int)((ulong)local_d8.deleter.m_deviceIface >> 0x20);
  data.deleter.m_device._0_4_ = (int)local_d8.deleter.m_device;
  data.deleter.m_device._4_4_ = (int)((ulong)local_d8.deleter.m_device >> 0x20);
  data.deleter.m_allocator._0_4_ = (int)local_d8.deleter.m_allocator;
  data.deleter.m_allocator._4_4_ = (int)((ulong)local_d8.deleter.m_allocator >> 0x20);
  ::vk::refdetails::Unique<vk::Handle<(vk::HandleType)17>_>::Unique
            ((Unique<vk::Handle<(vk::HandleType)17>_> *)local_b8,data);
  ::vk::refdetails::Move<vk::Handle<(vk::HandleType)17>_>::~Move(&local_f8);
  std::
  vector<de::SharedPtr<vk::refdetails::Unique<vk::Handle<(vk::HandleType)18>_>_>,_std::allocator<de::SharedPtr<vk::refdetails::Unique<vk::Handle<(vk::HandleType)18>_>_>_>_>
  ::vector((vector<de::SharedPtr<vk::refdetails::Unique<vk::Handle<(vk::HandleType)18>_>_>,_std::allocator<de::SharedPtr<vk::refdetails::Unique<vk::Handle<(vk::HandleType)18>_>_>_>_>
            *)&colorAttachments.
               super__Vector_base<de::SharedPtr<vk::refdetails::Unique<vk::Handle<(vk::HandleType)13>_>_>,_std::allocator<de::SharedPtr<vk::refdetails::Unique<vk::Handle<(vk::HandleType)13>_>_>_>_>
               ._M_impl.super__Vector_impl_data._M_end_of_storage);
  std::
  vector<de::SharedPtr<vk::refdetails::Unique<vk::Handle<(vk::HandleType)13>_>_>,_std::allocator<de::SharedPtr<vk::refdetails::Unique<vk::Handle<(vk::HandleType)13>_>_>_>_>
  ::vector((vector<de::SharedPtr<vk::refdetails::Unique<vk::Handle<(vk::HandleType)13>_>_>,_std::allocator<de::SharedPtr<vk::refdetails::Unique<vk::Handle<(vk::HandleType)13>_>_>_>_>
            *)&depthStencilAttachments.
               super__Vector_base<de::SharedPtr<vk::refdetails::Unique<vk::Handle<(vk::HandleType)13>_>_>,_std::allocator<de::SharedPtr<vk::refdetails::Unique<vk::Handle<(vk::HandleType)13>_>_>_>_>
               ._M_impl.super__Vector_impl_data._M_end_of_storage);
  std::
  vector<de::SharedPtr<vk::refdetails::Unique<vk::Handle<(vk::HandleType)13>_>_>,_std::allocator<de::SharedPtr<vk::refdetails::Unique<vk::Handle<(vk::HandleType)13>_>_>_>_>
  ::vector((vector<de::SharedPtr<vk::refdetails::Unique<vk::Handle<(vk::HandleType)13>_>_>,_std::allocator<de::SharedPtr<vk::refdetails::Unique<vk::Handle<(vk::HandleType)13>_>_>_>_>
            *)&attachmentHandles.
               super__Vector_base<vk::Handle<(vk::HandleType)13>,_std::allocator<vk::Handle<(vk::HandleType)13>_>_>
               ._M_impl.super__Vector_impl_data._M_end_of_storage);
  std::vector<vk::Handle<(vk::HandleType)13>,_std::allocator<vk::Handle<(vk::HandleType)13>_>_>::
  vector((vector<vk::Handle<(vk::HandleType)13>,_std::allocator<vk::Handle<(vk::HandleType)13>_>_> *
         )&basePipeline);
  ::vk::Handle<(vk::HandleType)18>::Handle(&stack0xfffffffffffffe90,0);
  for (local_174 = 0; (int)local_174 < numSlices; local_174 = local_174 + 1) {
    local_1b0.m_internal = colorImage.m_internal;
    viewType = getImageViewSliceType(caseDef->viewType);
    VVar1 = caseDef->colorFormat;
    ::vk::makeImageSubresourceRange(&local_1c8,1,mipLevel,1,local_174,1);
    subresourceRange.levelCount = local_1c8.levelCount;
    subresourceRange.aspectMask = local_1c8.aspectMask;
    subresourceRange.baseMipLevel = local_1c8.baseMipLevel;
    subresourceRange.baseArrayLayer = local_1c8.baseArrayLayer;
    subresourceRange.layerCount = local_1c8.layerCount;
    makeImageView(&local_1a8,vk_00,device_00,local_1b0,viewType,VVar1,subresourceRange);
    pipeline::(anonymous_namespace)::makeSharedPtr<vk::Handle<(vk::HandleType)13>>
              ((_anonymous_namespace_ *)&local_188,&local_1a8);
    std::
    vector<de::SharedPtr<vk::refdetails::Unique<vk::Handle<(vk::HandleType)13>_>_>,_std::allocator<de::SharedPtr<vk::refdetails::Unique<vk::Handle<(vk::HandleType)13>_>_>_>_>
    ::push_back((vector<de::SharedPtr<vk::refdetails::Unique<vk::Handle<(vk::HandleType)13>_>_>,_std::allocator<de::SharedPtr<vk::refdetails::Unique<vk::Handle<(vk::HandleType)13>_>_>_>_>
                 *)&depthStencilAttachments.
                    super__Vector_base<de::SharedPtr<vk::refdetails::Unique<vk::Handle<(vk::HandleType)13>_>_>,_std::allocator<de::SharedPtr<vk::refdetails::Unique<vk::Handle<(vk::HandleType)13>_>_>_>_>
                    ._M_impl.super__Vector_impl_data._M_end_of_storage,&local_188);
    de::SharedPtr<vk::refdetails::Unique<vk::Handle<(vk::HandleType)13>_>_>::~SharedPtr(&local_188);
    ::vk::refdetails::Move<vk::Handle<(vk::HandleType)13>_>::~Move(&local_1a8);
    pvVar5 = std::
             vector<de::SharedPtr<vk::refdetails::Unique<vk::Handle<(vk::HandleType)13>_>_>,_std::allocator<de::SharedPtr<vk::refdetails::Unique<vk::Handle<(vk::HandleType)13>_>_>_>_>
             ::back((vector<de::SharedPtr<vk::refdetails::Unique<vk::Handle<(vk::HandleType)13>_>_>,_std::allocator<de::SharedPtr<vk::refdetails::Unique<vk::Handle<(vk::HandleType)13>_>_>_>_>
                     *)&depthStencilAttachments.
                        super__Vector_base<de::SharedPtr<vk::refdetails::Unique<vk::Handle<(vk::HandleType)13>_>_>,_std::allocator<de::SharedPtr<vk::refdetails::Unique<vk::Handle<(vk::HandleType)13>_>_>_>_>
                        ._M_impl.super__Vector_impl_data._M_end_of_storage);
    pRVar6 = &de::SharedPtr<vk::refdetails::Unique<vk::Handle<(vk::HandleType)13>_>_>::operator*
                        (pvVar5)->super_RefBase<vk::Handle<(vk::HandleType)13>_>;
    pHVar7 = ::vk::refdetails::RefBase<vk::Handle<(vk::HandleType)13>_>::operator*(pRVar6);
    std::vector<vk::Handle<(vk::HandleType)13>,_std::allocator<vk::Handle<(vk::HandleType)13>_>_>::
    push_back((vector<vk::Handle<(vk::HandleType)13>,_std::allocator<vk::Handle<(vk::HandleType)13>_>_>
               *)&basePipeline,pHVar7);
    local_200.m_internal = HStack_170.m_internal;
    local_208.m_internal = pipelineLayout.m_internal;
    pHVar8 = ::vk::refdetails::RefBase<vk::Handle<(vk::HandleType)17>_>::operator*
                       ((RefBase<vk::Handle<(vk::HandleType)17>_> *)local_b8);
    local_210.m_internal = pHVar8->m_internal;
    local_218.m_internal = vertexModule.m_internal;
    local_220 = (VkShaderModule)fragmentModule.m_internal;
    tcu::Vector<int,_4>::swizzle((Vector<int,_4> *)local_228,(int)mipSize,0);
    makeGraphicsPipeline
              (&local_1f8,vk_00,device_00,local_200,local_208,local_210,local_218,local_220,
               (IVec2 *)local_228,VK_PRIMITIVE_TOPOLOGY_TRIANGLE_STRIP,local_174,
               (bool)(renderPass.super_RefBase<vk::Handle<(vk::HandleType)17>_>.m_data.deleter.
                      m_allocator._7_1_ & 1),
               (bool)(renderPass.super_RefBase<vk::Handle<(vk::HandleType)17>_>.m_data.deleter.
                      m_allocator._6_1_ & 1));
    pipeline::(anonymous_namespace)::makeSharedPtr<vk::Handle<(vk::HandleType)18>>
              ((_anonymous_namespace_ *)&local_1d8,&local_1f8);
    std::
    vector<de::SharedPtr<vk::refdetails::Unique<vk::Handle<(vk::HandleType)18>_>_>,_std::allocator<de::SharedPtr<vk::refdetails::Unique<vk::Handle<(vk::HandleType)18>_>_>_>_>
    ::push_back((vector<de::SharedPtr<vk::refdetails::Unique<vk::Handle<(vk::HandleType)18>_>_>,_std::allocator<de::SharedPtr<vk::refdetails::Unique<vk::Handle<(vk::HandleType)18>_>_>_>_>
                 *)&colorAttachments.
                    super__Vector_base<de::SharedPtr<vk::refdetails::Unique<vk::Handle<(vk::HandleType)13>_>_>,_std::allocator<de::SharedPtr<vk::refdetails::Unique<vk::Handle<(vk::HandleType)13>_>_>_>_>
                    ._M_impl.super__Vector_impl_data._M_end_of_storage,&local_1d8);
    de::SharedPtr<vk::refdetails::Unique<vk::Handle<(vk::HandleType)18>_>_>::~SharedPtr(&local_1d8);
    ::vk::refdetails::Move<vk::Handle<(vk::HandleType)18>_>::~Move(&local_1f8);
    pvVar9 = std::
             vector<de::SharedPtr<vk::refdetails::Unique<vk::Handle<(vk::HandleType)18>_>_>,_std::allocator<de::SharedPtr<vk::refdetails::Unique<vk::Handle<(vk::HandleType)18>_>_>_>_>
             ::front((vector<de::SharedPtr<vk::refdetails::Unique<vk::Handle<(vk::HandleType)18>_>_>,_std::allocator<de::SharedPtr<vk::refdetails::Unique<vk::Handle<(vk::HandleType)18>_>_>_>_>
                      *)&colorAttachments.
                         super__Vector_base<de::SharedPtr<vk::refdetails::Unique<vk::Handle<(vk::HandleType)13>_>_>,_std::allocator<de::SharedPtr<vk::refdetails::Unique<vk::Handle<(vk::HandleType)13>_>_>_>_>
                         ._M_impl.super__Vector_impl_data._M_end_of_storage);
    pRVar10 = &de::SharedPtr<vk::refdetails::Unique<vk::Handle<(vk::HandleType)18>_>_>::operator*
                         (pvVar9)->super_RefBase<vk::Handle<(vk::HandleType)18>_>;
    pHVar11 = ::vk::refdetails::RefBase<vk::Handle<(vk::HandleType)18>_>::operator*(pRVar10);
    HStack_170.m_internal = pHVar11->m_internal;
  }
  if (((renderPass.super_RefBase<vk::Handle<(vk::HandleType)17>_>.m_data.deleter.m_allocator._7_1_ &
       1) != 0) ||
     ((renderPass.super_RefBase<vk::Handle<(vk::HandleType)17>_>.m_data.deleter.m_allocator._6_1_ &
      1) != 0)) {
    for (local_22c = 0; (int)local_22c < numSlices; local_22c = local_22c + 1) {
      VVar1 = caseDef->depthStencilFormat;
      ::vk::makeImageSubresourceRange
                ((VkImageSubresourceRange *)
                 &framebuffer.super_RefBase<vk::Handle<(vk::HandleType)23>_>.m_data.deleter.
                  m_allocator,aspectMask,mipLevel,1,local_22c,1);
      subresourceRange_00.levelCount = (int)uStack_278;
      subresourceRange_00._0_8_ =
           framebuffer.super_RefBase<vk::Handle<(vk::HandleType)23>_>.m_data.deleter.m_allocator;
      subresourceRange_00.baseArrayLayer = (int)((ulong)uStack_278 >> 0x20);
      subresourceRange_00.layerCount = local_270;
      makeImageView(&local_260,vk_00,device_00,depthStencilImage,VK_IMAGE_VIEW_TYPE_2D,VVar1,
                    subresourceRange_00);
      pipeline::(anonymous_namespace)::makeSharedPtr<vk::Handle<(vk::HandleType)13>>
                ((_anonymous_namespace_ *)&local_240,&local_260);
      std::
      vector<de::SharedPtr<vk::refdetails::Unique<vk::Handle<(vk::HandleType)13>_>_>,_std::allocator<de::SharedPtr<vk::refdetails::Unique<vk::Handle<(vk::HandleType)13>_>_>_>_>
      ::push_back((vector<de::SharedPtr<vk::refdetails::Unique<vk::Handle<(vk::HandleType)13>_>_>,_std::allocator<de::SharedPtr<vk::refdetails::Unique<vk::Handle<(vk::HandleType)13>_>_>_>_>
                   *)&attachmentHandles.
                      super__Vector_base<vk::Handle<(vk::HandleType)13>,_std::allocator<vk::Handle<(vk::HandleType)13>_>_>
                      ._M_impl.super__Vector_impl_data._M_end_of_storage,&local_240);
      de::SharedPtr<vk::refdetails::Unique<vk::Handle<(vk::HandleType)13>_>_>::~SharedPtr
                (&local_240);
      ::vk::refdetails::Move<vk::Handle<(vk::HandleType)13>_>::~Move(&local_260);
      pvVar5 = std::
               vector<de::SharedPtr<vk::refdetails::Unique<vk::Handle<(vk::HandleType)13>_>_>,_std::allocator<de::SharedPtr<vk::refdetails::Unique<vk::Handle<(vk::HandleType)13>_>_>_>_>
               ::back((vector<de::SharedPtr<vk::refdetails::Unique<vk::Handle<(vk::HandleType)13>_>_>,_std::allocator<de::SharedPtr<vk::refdetails::Unique<vk::Handle<(vk::HandleType)13>_>_>_>_>
                       *)&attachmentHandles.
                          super__Vector_base<vk::Handle<(vk::HandleType)13>,_std::allocator<vk::Handle<(vk::HandleType)13>_>_>
                          ._M_impl.super__Vector_impl_data._M_end_of_storage);
      pRVar6 = &de::SharedPtr<vk::refdetails::Unique<vk::Handle<(vk::HandleType)13>_>_>::operator*
                          (pvVar5)->super_RefBase<vk::Handle<(vk::HandleType)13>_>;
      pHVar7 = ::vk::refdetails::RefBase<vk::Handle<(vk::HandleType)13>_>::operator*(pRVar6);
      std::vector<vk::Handle<(vk::HandleType)13>,_std::allocator<vk::Handle<(vk::HandleType)13>_>_>
      ::push_back((vector<vk::Handle<(vk::HandleType)13>,_std::allocator<vk::Handle<(vk::HandleType)13>_>_>
                   *)&basePipeline,pHVar7);
    }
  }
  pHVar8 = ::vk::refdetails::RefBase<vk::Handle<(vk::HandleType)17>_>::operator*
                     ((RefBase<vk::Handle<(vk::HandleType)17>_> *)local_b8);
  cmdPool.super_RefBase<vk::Handle<(vk::HandleType)24>_>.m_data.deleter.m_allocator =
       (VkAllocationCallbacks *)pHVar8->m_internal;
  sVar12 = std::
           vector<vk::Handle<(vk::HandleType)13>,_std::allocator<vk::Handle<(vk::HandleType)13>_>_>
           ::size((vector<vk::Handle<(vk::HandleType)13>,_std::allocator<vk::Handle<(vk::HandleType)13>_>_>
                   *)&basePipeline);
  pAttachments = std::
                 vector<vk::Handle<(vk::HandleType)13>,_std::allocator<vk::Handle<(vk::HandleType)13>_>_>
                 ::operator[]((vector<vk::Handle<(vk::HandleType)13>,_std::allocator<vk::Handle<(vk::HandleType)13>_>_>
                               *)&basePipeline,0);
  dVar4 = tcu::Vector<int,_4>::x(mipSize);
  height = tcu::Vector<int,_4>::y(mipSize);
  makeFramebuffer(&local_2e0,vk_00,device_00,
                  (VkRenderPass)
                  cmdPool.super_RefBase<vk::Handle<(vk::HandleType)24>_>.m_data.deleter.m_allocator,
                  (deUint32)sVar12,pAttachments,dVar4,height,1);
  ::vk::refdetails::Move::operator_cast_to_RefData(&local_2c0,(Move *)&local_2e0);
  data_00.deleter.m_deviceIface._0_4_ = (int)local_2c0.deleter.m_deviceIface;
  data_00.object.m_internal = local_2c0.object.m_internal;
  data_00.deleter.m_deviceIface._4_4_ = (int)((ulong)local_2c0.deleter.m_deviceIface >> 0x20);
  data_00.deleter.m_device._0_4_ = (int)local_2c0.deleter.m_device;
  data_00.deleter.m_device._4_4_ = (int)((ulong)local_2c0.deleter.m_device >> 0x20);
  data_00.deleter.m_allocator._0_4_ = (int)local_2c0.deleter.m_allocator;
  data_00.deleter.m_allocator._4_4_ = (int)((ulong)local_2c0.deleter.m_allocator >> 0x20);
  ::vk::refdetails::Unique<vk::Handle<(vk::HandleType)23>_>::Unique
            ((Unique<vk::Handle<(vk::HandleType)23>_> *)local_2a0,data_00);
  ::vk::refdetails::Move<vk::Handle<(vk::HandleType)23>_>::~Move(&local_2e0);
  ::vk::createCommandPool
            ((Move<vk::Handle<(vk::HandleType)24>_> *)
             &cmdBuffer.super_RefBase<vk::VkCommandBuffer_s_*>.m_data.deleter.m_pool,vk_00,device_00
             ,2,dVar3,(VkAllocationCallbacks *)0x0);
  ::vk::refdetails::Move::operator_cast_to_RefData
            (&local_328,
             (Move *)&cmdBuffer.super_RefBase<vk::VkCommandBuffer_s_*>.m_data.deleter.m_pool);
  data_01.deleter.m_deviceIface._0_4_ = (int)local_328.deleter.m_deviceIface;
  data_01.object.m_internal = local_328.object.m_internal;
  data_01.deleter.m_deviceIface._4_4_ = (int)((ulong)local_328.deleter.m_deviceIface >> 0x20);
  data_01.deleter.m_device._0_4_ = (int)local_328.deleter.m_device;
  data_01.deleter.m_device._4_4_ = (int)((ulong)local_328.deleter.m_device >> 0x20);
  data_01.deleter.m_allocator._0_4_ = (int)local_328.deleter.m_allocator;
  data_01.deleter.m_allocator._4_4_ = (int)((ulong)local_328.deleter.m_allocator >> 0x20);
  ::vk::refdetails::Unique<vk::Handle<(vk::HandleType)24>_>::Unique
            ((Unique<vk::Handle<(vk::HandleType)24>_> *)local_308,data_01);
  ::vk::refdetails::Move<vk::Handle<(vk::HandleType)24>_>::~Move
            ((Move<vk::Handle<(vk::HandleType)24>_> *)
             &cmdBuffer.super_RefBase<vk::VkCommandBuffer_s_*>.m_data.deleter.m_pool);
  pHVar13 = ::vk::refdetails::RefBase<vk::Handle<(vk::HandleType)24>_>::operator*
                      ((RefBase<vk::Handle<(vk::HandleType)24>_> *)local_308);
  clearValues.super__Vector_base<vk::VkClearValue,_std::allocator<vk::VkClearValue>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)pHVar13->m_internal;
  makeCommandBuffer(&local_3a8,vk_00,device_00,
                    (VkCommandPool)
                    clearValues.
                    super__Vector_base<vk::VkClearValue,_std::allocator<vk::VkClearValue>_>._M_impl.
                    super__Vector_impl_data._M_end_of_storage);
  ::vk::refdetails::Move::operator_cast_to_RefData(&local_388,(Move *)&local_3a8);
  data_02.deleter.m_deviceIface._0_4_ = (int)local_388.deleter.m_deviceIface;
  data_02.object = local_388.object;
  data_02.deleter.m_deviceIface._4_4_ = (int)((ulong)local_388.deleter.m_deviceIface >> 0x20);
  data_02.deleter.m_device._0_4_ = (int)local_388.deleter.m_device;
  data_02.deleter.m_device._4_4_ = (int)((ulong)local_388.deleter.m_device >> 0x20);
  data_02.deleter.m_pool.m_internal._0_4_ = (int)local_388.deleter.m_pool.m_internal;
  data_02.deleter.m_pool.m_internal._4_4_ = (int)(local_388.deleter.m_pool.m_internal >> 0x20);
  ::vk::refdetails::Unique<vk::VkCommandBuffer_s_*>::Unique
            ((Unique<vk::VkCommandBuffer_s_*> *)local_368,data_02);
  ::vk::refdetails::Move<vk::VkCommandBuffer_s_*>::~Move(&local_3a8);
  ppVVar14 = ::vk::refdetails::RefBase<vk::VkCommandBuffer_s_*>::operator*
                       ((RefBase<vk::VkCommandBuffer_s_*> *)local_368);
  beginCommandBuffer(vk_00,*ppVVar14);
  local_3d8 = getClearValue(caseDef->colorFormat);
  std::allocator<vk::VkClearValue>::allocator(&local_3d9);
  std::vector<vk::VkClearValue,_std::allocator<vk::VkClearValue>_>::vector
            ((vector<vk::VkClearValue,_std::allocator<vk::VkClearValue>_> *)local_3c8,
             (long)numSlices,&local_3d8,&local_3d9);
  std::allocator<vk::VkClearValue>::~allocator(&local_3d9);
  if (((renderPass.super_RefBase<vk::Handle<(vk::HandleType)17>_>.m_data.deleter.m_allocator._7_1_ &
       1) != 0) ||
     ((renderPass.super_RefBase<vk::Handle<(vk::HandleType)17>_>.m_data.deleter.m_allocator._6_1_ &
      1) != 0)) {
    local_3f0._M_current =
         (VkClearValue *)
         std::vector<vk::VkClearValue,_std::allocator<vk::VkClearValue>_>::end
                   ((vector<vk::VkClearValue,_std::allocator<vk::VkClearValue>_> *)local_3c8);
    __gnu_cxx::
    __normal_iterator<vk::VkClearValue_const*,std::vector<vk::VkClearValue,std::allocator<vk::VkClearValue>>>
    ::__normal_iterator<vk::VkClearValue*>
              ((__normal_iterator<vk::VkClearValue_const*,std::vector<vk::VkClearValue,std::allocator<vk::VkClearValue>>>
                *)&local_3e8,&local_3f0);
    local_400 = ::vk::makeClearValueDepthStencil(1.0,0x2a);
    std::vector<vk::VkClearValue,_std::allocator<vk::VkClearValue>_>::insert
              ((vector<vk::VkClearValue,_std::allocator<vk::VkClearValue>_> *)local_3c8,local_3e8,
               (long)numSlices,&local_400);
  }
  renderPassBeginInfo.pClearValues = (VkClearValue *)::vk::makeOffset2D(0,0);
  dVar3 = tcu::Vector<int,_4>::x(mipSize);
  dVar4 = tcu::Vector<int,_4>::y(mipSize);
  VVar15 = ::vk::makeExtent2D(dVar3,dVar4);
  vertexBufferOffset._0_4_ = 0x2b;
  renderPassBeginInfo.sType = VK_STRUCTURE_TYPE_APPLICATION_INFO;
  renderPassBeginInfo._4_4_ = 0;
  pHVar8 = ::vk::refdetails::RefBase<vk::Handle<(vk::HandleType)17>_>::operator*
                     ((RefBase<vk::Handle<(vk::HandleType)17>_> *)local_b8);
  renderPassBeginInfo.pNext = (void *)pHVar8->m_internal;
  pHVar16 = ::vk::refdetails::RefBase<vk::Handle<(vk::HandleType)23>_>::operator*
                      ((RefBase<vk::Handle<(vk::HandleType)23>_> *)local_2a0);
  renderPassBeginInfo.renderPass.m_internal = pHVar16->m_internal;
  renderPassBeginInfo.framebuffer.m_internal = (deUint64)renderPassBeginInfo.pClearValues;
  renderPassBeginInfo.renderArea.offset = (VkOffset2D)VVar15;
  sVar12 = std::vector<vk::VkClearValue,_std::allocator<vk::VkClearValue>_>::size
                     ((vector<vk::VkClearValue,_std::allocator<vk::VkClearValue>_> *)local_3c8);
  renderPassBeginInfo.renderArea.extent.width = (deUint32)sVar12;
  renderPassBeginInfo._48_8_ =
       std::vector<vk::VkClearValue,_std::allocator<vk::VkClearValue>_>::operator[]
                 ((vector<vk::VkClearValue,_std::allocator<vk::VkClearValue>_> *)local_3c8,0);
  uStack_460 = 0;
  ppVVar14 = ::vk::refdetails::RefBase<vk::VkCommandBuffer_s_*>::operator*
                       ((RefBase<vk::VkCommandBuffer_s_*> *)local_368);
  (*vk_00->_vptr_DeviceInterface[0x74])(vk_00,*ppVVar14,&vertexBufferOffset,0);
  ppVVar14 = ::vk::refdetails::RefBase<vk::VkCommandBuffer_s_*>::operator*
                       ((RefBase<vk::VkCommandBuffer_s_*> *)local_368);
  (*vk_00->_vptr_DeviceInterface[0x58])
            (vk_00,*ppVVar14,0,1,&pipelineLayout_local,&stack0xfffffffffffffba0);
  std::vector<vk::VkClearValue,_std::allocator<vk::VkClearValue>_>::~vector
            ((vector<vk::VkClearValue,_std::allocator<vk::VkClearValue>_> *)local_3c8);
  for (local_464 = 0; local_464 < (uint)numSlices; local_464 = local_464 + 1) {
    if (local_464 != 0) {
      ppVVar14 = ::vk::refdetails::RefBase<vk::VkCommandBuffer_s_*>::operator*
                           ((RefBase<vk::VkCommandBuffer_s_*> *)local_368);
      (*vk_00->_vptr_DeviceInterface[0x75])(vk_00,*ppVVar14,0);
    }
    ppVVar14 = ::vk::refdetails::RefBase<vk::VkCommandBuffer_s_*>::operator*
                         ((RefBase<vk::VkCommandBuffer_s_*> *)local_368);
    pVVar2 = *ppVVar14;
    pvVar9 = std::
             vector<de::SharedPtr<vk::refdetails::Unique<vk::Handle<(vk::HandleType)18>_>_>,_std::allocator<de::SharedPtr<vk::refdetails::Unique<vk::Handle<(vk::HandleType)18>_>_>_>_>
             ::operator[]((vector<de::SharedPtr<vk::refdetails::Unique<vk::Handle<(vk::HandleType)18>_>_>,_std::allocator<de::SharedPtr<vk::refdetails::Unique<vk::Handle<(vk::HandleType)18>_>_>_>_>
                           *)&colorAttachments.
                              super__Vector_base<de::SharedPtr<vk::refdetails::Unique<vk::Handle<(vk::HandleType)13>_>_>,_std::allocator<de::SharedPtr<vk::refdetails::Unique<vk::Handle<(vk::HandleType)13>_>_>_>_>
                              ._M_impl.super__Vector_impl_data._M_end_of_storage,(ulong)local_464);
    pRVar10 = &de::SharedPtr<vk::refdetails::Unique<vk::Handle<(vk::HandleType)18>_>_>::operator*
                         (pvVar9)->super_RefBase<vk::Handle<(vk::HandleType)18>_>;
    pHVar11 = ::vk::refdetails::RefBase<vk::Handle<(vk::HandleType)18>_>::operator*(pRVar10);
    (*vk_00->_vptr_DeviceInterface[0x4c])(vk_00,pVVar2,0,pHVar11->m_internal);
    ppVVar14 = ::vk::refdetails::RefBase<vk::VkCommandBuffer_s_*>::operator*
                         ((RefBase<vk::VkCommandBuffer_s_*> *)local_368);
    (*vk_00->_vptr_DeviceInterface[0x59])(vk_00,*ppVVar14,4,1,(ulong)(local_464 << 2),0);
  }
  ppVVar14 = ::vk::refdetails::RefBase<vk::VkCommandBuffer_s_*>::operator*
                       ((RefBase<vk::VkCommandBuffer_s_*> *)local_368);
  (*vk_00->_vptr_DeviceInterface[0x76])(vk_00,*ppVVar14);
  ppVVar14 = ::vk::refdetails::RefBase<vk::VkCommandBuffer_s_*>::operator*
                       ((RefBase<vk::VkCommandBuffer_s_*> *)local_368);
  result = (*vk_00->_vptr_DeviceInterface[0x4a])(vk_00,*ppVVar14);
  ::vk::checkResult(result,"vk.endCommandBuffer(*cmdBuffer)",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/vulkancts/modules/vulkan/pipeline/vktPipelineRenderToImageTests.cpp"
                    ,0x4d4);
  ppVVar14 = ::vk::refdetails::RefBase<vk::VkCommandBuffer_s_*>::operator*
                       ((RefBase<vk::VkCommandBuffer_s_*> *)local_368);
  submitCommandsAndWait(vk_00,device_00,queue_00,*ppVVar14);
  ::vk::refdetails::Unique<vk::VkCommandBuffer_s_*>::~Unique
            ((Unique<vk::VkCommandBuffer_s_*> *)local_368);
  ::vk::refdetails::Unique<vk::Handle<(vk::HandleType)24>_>::~Unique
            ((Unique<vk::Handle<(vk::HandleType)24>_> *)local_308);
  ::vk::refdetails::Unique<vk::Handle<(vk::HandleType)23>_>::~Unique
            ((Unique<vk::Handle<(vk::HandleType)23>_> *)local_2a0);
  std::vector<vk::Handle<(vk::HandleType)13>,_std::allocator<vk::Handle<(vk::HandleType)13>_>_>::
  ~vector((vector<vk::Handle<(vk::HandleType)13>,_std::allocator<vk::Handle<(vk::HandleType)13>_>_>
           *)&basePipeline);
  std::
  vector<de::SharedPtr<vk::refdetails::Unique<vk::Handle<(vk::HandleType)13>_>_>,_std::allocator<de::SharedPtr<vk::refdetails::Unique<vk::Handle<(vk::HandleType)13>_>_>_>_>
  ::~vector((vector<de::SharedPtr<vk::refdetails::Unique<vk::Handle<(vk::HandleType)13>_>_>,_std::allocator<de::SharedPtr<vk::refdetails::Unique<vk::Handle<(vk::HandleType)13>_>_>_>_>
             *)&attachmentHandles.
                super__Vector_base<vk::Handle<(vk::HandleType)13>,_std::allocator<vk::Handle<(vk::HandleType)13>_>_>
                ._M_impl.super__Vector_impl_data._M_end_of_storage);
  std::
  vector<de::SharedPtr<vk::refdetails::Unique<vk::Handle<(vk::HandleType)13>_>_>,_std::allocator<de::SharedPtr<vk::refdetails::Unique<vk::Handle<(vk::HandleType)13>_>_>_>_>
  ::~vector((vector<de::SharedPtr<vk::refdetails::Unique<vk::Handle<(vk::HandleType)13>_>_>,_std::allocator<de::SharedPtr<vk::refdetails::Unique<vk::Handle<(vk::HandleType)13>_>_>_>_>
             *)&depthStencilAttachments.
                super__Vector_base<de::SharedPtr<vk::refdetails::Unique<vk::Handle<(vk::HandleType)13>_>_>,_std::allocator<de::SharedPtr<vk::refdetails::Unique<vk::Handle<(vk::HandleType)13>_>_>_>_>
                ._M_impl.super__Vector_impl_data._M_end_of_storage);
  std::
  vector<de::SharedPtr<vk::refdetails::Unique<vk::Handle<(vk::HandleType)18>_>_>,_std::allocator<de::SharedPtr<vk::refdetails::Unique<vk::Handle<(vk::HandleType)18>_>_>_>_>
  ::~vector((vector<de::SharedPtr<vk::refdetails::Unique<vk::Handle<(vk::HandleType)18>_>_>,_std::allocator<de::SharedPtr<vk::refdetails::Unique<vk::Handle<(vk::HandleType)18>_>_>_>_>
             *)&colorAttachments.
                super__Vector_base<de::SharedPtr<vk::refdetails::Unique<vk::Handle<(vk::HandleType)13>_>_>,_std::allocator<de::SharedPtr<vk::refdetails::Unique<vk::Handle<(vk::HandleType)13>_>_>_>_>
                ._M_impl.super__Vector_impl_data._M_end_of_storage);
  ::vk::refdetails::Unique<vk::Handle<(vk::HandleType)17>_>::~Unique
            ((Unique<vk::Handle<(vk::HandleType)17>_> *)local_b8);
  return;
}

Assistant:

void drawToMipLevel (const Context&				context,
					 const CaseDef&				caseDef,
					 const int					mipLevel,
					 const IVec4&				mipSize,
					 const int					numSlices,
					 const VkImage				colorImage,
					 const VkImage				depthStencilImage,
					 const VkBuffer				vertexBuffer,
					 const VkPipelineLayout		pipelineLayout,
					 const VkShaderModule		vertexModule,
					 const VkShaderModule		fragmentModule)
{
	const DeviceInterface&			vk					= context.getDeviceInterface();
	const VkDevice					device				= context.getDevice();
	const VkQueue					queue				= context.getUniversalQueue();
	const deUint32					queueFamilyIndex	= context.getUniversalQueueFamilyIndex();
	const VkImageAspectFlags		depthStencilAspect	= getFormatAspectFlags(caseDef.depthStencilFormat);
	const bool						useDepth			= (depthStencilAspect & VK_IMAGE_ASPECT_DEPTH_BIT)   != 0;
	const bool						useStencil			= (depthStencilAspect & VK_IMAGE_ASPECT_STENCIL_BIT) != 0;
	const Unique<VkRenderPass>		renderPass			(makeRenderPass(vk, device, caseDef.colorFormat, caseDef.depthStencilFormat, static_cast<deUint32>(numSlices),
																		VK_IMAGE_LAYOUT_COLOR_ATTACHMENT_OPTIMAL,
																		VK_IMAGE_LAYOUT_DEPTH_STENCIL_ATTACHMENT_OPTIMAL));
	vector<SharedPtrVkPipeline>		pipelines;
	vector<SharedPtrVkImageView>	colorAttachments;
	vector<SharedPtrVkImageView>	depthStencilAttachments;
	vector<VkImageView>				attachmentHandles;			// all attachments (color and d/s)

	// For each image layer or slice (3D), create an attachment and a pipeline
	{
		VkPipeline					basePipeline			= DE_NULL;

		// Color attachments are first in the framebuffer
		for (int subpassNdx = 0; subpassNdx < numSlices; ++subpassNdx)
		{
			colorAttachments.push_back(makeSharedPtr(makeImageView(
				vk, device, colorImage, getImageViewSliceType(caseDef.viewType), caseDef.colorFormat,
				makeImageSubresourceRange(VK_IMAGE_ASPECT_COLOR_BIT, mipLevel, 1u, subpassNdx, 1u))));
			attachmentHandles.push_back(**colorAttachments.back());

			// We also have to create pipelines for each subpass
			pipelines.push_back(makeSharedPtr(makeGraphicsPipeline(
				vk, device, basePipeline, pipelineLayout, *renderPass, vertexModule, fragmentModule, mipSize.swizzle(0, 1), VK_PRIMITIVE_TOPOLOGY_TRIANGLE_STRIP,
				static_cast<deUint32>(subpassNdx), useDepth, useStencil)));

			basePipeline = **pipelines.front();
		}

		// Then D/S attachments, if any
		if (useDepth || useStencil)
		for (int subpassNdx = 0; subpassNdx < numSlices; ++subpassNdx)
		{
			depthStencilAttachments.push_back(makeSharedPtr(makeImageView(
				vk, device, depthStencilImage, VK_IMAGE_VIEW_TYPE_2D, caseDef.depthStencilFormat,
				makeImageSubresourceRange(depthStencilAspect, mipLevel, 1u, subpassNdx, 1u))));
			attachmentHandles.push_back(**depthStencilAttachments.back());
		}
	}

	const Unique<VkFramebuffer>			framebuffer (makeFramebuffer(vk, device, *renderPass, static_cast<deUint32>(attachmentHandles.size()), &attachmentHandles[0],
																	 static_cast<deUint32>(mipSize.x()), static_cast<deUint32>(mipSize.y())));

	{
		const Unique<VkCommandPool>		cmdPool		(createCommandPool(vk, device, VK_COMMAND_POOL_CREATE_RESET_COMMAND_BUFFER_BIT, queueFamilyIndex));
		const Unique<VkCommandBuffer>	cmdBuffer	(makeCommandBuffer(vk, device, *cmdPool));

		beginCommandBuffer(vk, *cmdBuffer);
		{
			vector<VkClearValue>	clearValues	(numSlices, getClearValue(caseDef.colorFormat));

			if (useDepth || useStencil)
				clearValues.insert(clearValues.end(), numSlices, makeClearValueDepthStencil(REFERENCE_DEPTH_VALUE, REFERENCE_STENCIL_VALUE));

			const VkRect2D			renderArea	=
			{
				makeOffset2D(0, 0),
				makeExtent2D(mipSize.x(), mipSize.y()),
			};
			const VkRenderPassBeginInfo	renderPassBeginInfo	=
			{
				VK_STRUCTURE_TYPE_RENDER_PASS_BEGIN_INFO,	// VkStructureType         sType;
				DE_NULL,									// const void*             pNext;
				*renderPass,								// VkRenderPass            renderPass;
				*framebuffer,								// VkFramebuffer           framebuffer;
				renderArea,									// VkRect2D                renderArea;
				static_cast<deUint32>(clearValues.size()),	// uint32_t                clearValueCount;
				&clearValues[0],							// const VkClearValue*     pClearValues;
			};
			const VkDeviceSize		vertexBufferOffset	= 0ull;

			vk.cmdBeginRenderPass(*cmdBuffer, &renderPassBeginInfo, VK_SUBPASS_CONTENTS_INLINE);
			vk.cmdBindVertexBuffers(*cmdBuffer, 0u, 1u, &vertexBuffer, &vertexBufferOffset);
		}

		// Draw
		for (deUint32 subpassNdx = 0; subpassNdx < static_cast<deUint32>(numSlices); ++subpassNdx)
		{
			if (subpassNdx != 0)
				vk.cmdNextSubpass(*cmdBuffer, VK_SUBPASS_CONTENTS_INLINE);

			vk.cmdBindPipeline(*cmdBuffer, VK_PIPELINE_BIND_POINT_GRAPHICS, **pipelines[subpassNdx]);
			vk.cmdDraw(*cmdBuffer, 4u, 1u, subpassNdx*4u, 0u);
		}

		vk.cmdEndRenderPass(*cmdBuffer);

		VK_CHECK(vk.endCommandBuffer(*cmdBuffer));
		submitCommandsAndWait(vk, device, queue, *cmdBuffer);
	}
}